

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

TextureFormat vk::mapVkFormat(VkFormat format)

{
  InternalError *this;
  TextureFormat TStack_10;
  VkFormat format_local;
  
  switch(format) {
  case VK_FORMAT_R4G4_UNORM_PACK8:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNORM_BYTE_44);
    break;
  case VK_FORMAT_R4G4B4A4_UNORM_PACK16:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_SHORT_4444);
    break;
  case VK_FORMAT_B4G4R4A4_UNORM_PACK16:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,UNORM_SHORT_4444);
    break;
  case VK_FORMAT_R5G6B5_UNORM_PACK16:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_SHORT_565);
    break;
  case VK_FORMAT_B5G6R5_UNORM_PACK16:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGR,UNORM_SHORT_565);
    break;
  case VK_FORMAT_R5G5B5A1_UNORM_PACK16:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_SHORT_5551);
    break;
  case VK_FORMAT_B5G5R5A1_UNORM_PACK16:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,UNORM_SHORT_5551);
    break;
  case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,ARGB,UNORM_SHORT_1555);
    break;
  case VK_FORMAT_R8_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNORM_INT8);
    break;
  case VK_FORMAT_R8_SNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SNORM_INT8);
    break;
  case VK_FORMAT_R8_USCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNSIGNED_INT8);
    break;
  case VK_FORMAT_R8_SSCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SIGNED_INT8);
    break;
  case VK_FORMAT_R8_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNSIGNED_INT8);
    break;
  case VK_FORMAT_R8_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SIGNED_INT8);
    break;
  case VK_FORMAT_R8_SRGB:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sR,UNORM_INT8);
    break;
  case VK_FORMAT_R8G8_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNORM_INT8);
    break;
  case VK_FORMAT_R8G8_SNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SNORM_INT8);
    break;
  case VK_FORMAT_R8G8_USCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNSIGNED_INT8);
    break;
  case VK_FORMAT_R8G8_SSCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SIGNED_INT8);
    break;
  case VK_FORMAT_R8G8_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNSIGNED_INT8);
    break;
  case VK_FORMAT_R8G8_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SIGNED_INT8);
    break;
  case VK_FORMAT_R8G8_SRGB:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRG,UNORM_INT8);
    break;
  case VK_FORMAT_R8G8B8_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_INT8);
    break;
  case VK_FORMAT_R8G8B8_SNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SNORM_INT8);
    break;
  case VK_FORMAT_R8G8B8_USCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT8);
    break;
  case VK_FORMAT_R8G8B8_SSCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SIGNED_INT8);
    break;
  case VK_FORMAT_R8G8B8_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT8);
    break;
  case VK_FORMAT_R8G8B8_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SIGNED_INT8);
    break;
  case VK_FORMAT_R8G8B8_SRGB:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRGB,UNORM_INT8);
    break;
  case VK_FORMAT_B8G8R8_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGR,UNORM_INT8);
    break;
  case VK_FORMAT_B8G8R8_SNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGR,SNORM_INT8);
    break;
  case VK_FORMAT_B8G8R8_USCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGR,UNSIGNED_INT8);
    break;
  case VK_FORMAT_B8G8R8_SSCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGR,SIGNED_INT8);
    break;
  case VK_FORMAT_B8G8R8_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGR,UNSIGNED_INT8);
    break;
  case VK_FORMAT_B8G8R8_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGR,SIGNED_INT8);
    break;
  case VK_FORMAT_B8G8R8_SRGB:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sBGR,UNORM_INT8);
    break;
  case VK_FORMAT_R8G8B8A8_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT8);
    break;
  case VK_FORMAT_R8G8B8A8_SNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SNORM_INT8);
    break;
  case VK_FORMAT_R8G8B8A8_USCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT8);
    break;
  case VK_FORMAT_R8G8B8A8_SSCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT8);
    break;
  case VK_FORMAT_R8G8B8A8_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT8);
    break;
  case VK_FORMAT_R8G8B8A8_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT8);
    break;
  case VK_FORMAT_R8G8B8A8_SRGB:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRGBA,UNORM_INT8);
    break;
  case VK_FORMAT_B8G8R8A8_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,UNORM_INT8);
    break;
  case VK_FORMAT_B8G8R8A8_SNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,SNORM_INT8);
    break;
  case VK_FORMAT_B8G8R8A8_USCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,UNSIGNED_INT8);
    break;
  case VK_FORMAT_B8G8R8A8_SSCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,SIGNED_INT8);
    break;
  case VK_FORMAT_B8G8R8A8_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,UNSIGNED_INT8);
    break;
  case VK_FORMAT_B8G8R8A8_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,SIGNED_INT8);
    break;
  case VK_FORMAT_B8G8R8A8_SRGB:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sBGRA,UNORM_INT8);
    break;
  case VK_FORMAT_A8B8G8R8_UNORM_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT8);
    break;
  case VK_FORMAT_A8B8G8R8_SNORM_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SNORM_INT8);
    break;
  case VK_FORMAT_A8B8G8R8_USCALED_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT8);
    break;
  case VK_FORMAT_A8B8G8R8_SSCALED_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT8);
    break;
  case VK_FORMAT_A8B8G8R8_UINT_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT8);
    break;
  case VK_FORMAT_A8B8G8R8_SINT_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT8);
    break;
  case VK_FORMAT_A8B8G8R8_SRGB_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRGBA,UNORM_INT8);
    break;
  case VK_FORMAT_A2R10G10B10_UNORM_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,UNORM_INT_1010102_REV);
    break;
  case VK_FORMAT_A2R10G10B10_SNORM_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,SNORM_INT_1010102_REV);
    break;
  case VK_FORMAT_A2R10G10B10_USCALED_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,UNSIGNED_INT_1010102_REV);
    break;
  case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,SIGNED_INT_1010102_REV);
    break;
  case VK_FORMAT_A2R10G10B10_UINT_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,UNSIGNED_INT_1010102_REV);
    break;
  case VK_FORMAT_A2R10G10B10_SINT_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,BGRA,SIGNED_INT_1010102_REV);
    break;
  case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT_1010102_REV);
    break;
  case VK_FORMAT_A2B10G10R10_SNORM_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SNORM_INT_1010102_REV);
    break;
  case VK_FORMAT_A2B10G10R10_USCALED_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT_1010102_REV);
    break;
  case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT_1010102_REV);
    break;
  case VK_FORMAT_A2B10G10R10_UINT_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT_1010102_REV);
    break;
  case VK_FORMAT_A2B10G10R10_SINT_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT_1010102_REV);
    break;
  case VK_FORMAT_R16_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNORM_INT16);
    break;
  case VK_FORMAT_R16_SNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SNORM_INT16);
    break;
  case VK_FORMAT_R16_USCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNSIGNED_INT16);
    break;
  case VK_FORMAT_R16_SSCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SIGNED_INT16);
    break;
  case VK_FORMAT_R16_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNSIGNED_INT16);
    break;
  case VK_FORMAT_R16_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SIGNED_INT16);
    break;
  case VK_FORMAT_R16_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,HALF_FLOAT);
    break;
  case VK_FORMAT_R16G16_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNORM_INT16);
    break;
  case VK_FORMAT_R16G16_SNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SNORM_INT16);
    break;
  case VK_FORMAT_R16G16_USCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNSIGNED_INT16);
    break;
  case VK_FORMAT_R16G16_SSCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SIGNED_INT16);
    break;
  case VK_FORMAT_R16G16_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNSIGNED_INT16);
    break;
  case VK_FORMAT_R16G16_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SIGNED_INT16);
    break;
  case VK_FORMAT_R16G16_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,HALF_FLOAT);
    break;
  case VK_FORMAT_R16G16B16_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_INT16);
    break;
  case VK_FORMAT_R16G16B16_SNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SNORM_INT16);
    break;
  case VK_FORMAT_R16G16B16_USCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT16);
    break;
  case VK_FORMAT_R16G16B16_SSCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SIGNED_INT16);
    break;
  case VK_FORMAT_R16G16B16_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT16);
    break;
  case VK_FORMAT_R16G16B16_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SIGNED_INT16);
    break;
  case VK_FORMAT_R16G16B16_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,HALF_FLOAT);
    break;
  case VK_FORMAT_R16G16B16A16_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT16);
    break;
  case VK_FORMAT_R16G16B16A16_SNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SNORM_INT16);
    break;
  case VK_FORMAT_R16G16B16A16_USCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT16);
    break;
  case VK_FORMAT_R16G16B16A16_SSCALED:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT16);
    break;
  case VK_FORMAT_R16G16B16A16_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT16);
    break;
  case VK_FORMAT_R16G16B16A16_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT16);
    break;
  case VK_FORMAT_R16G16B16A16_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,HALF_FLOAT);
    break;
  case VK_FORMAT_R32_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNSIGNED_INT32);
    break;
  case VK_FORMAT_R32_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SIGNED_INT32);
    break;
  case VK_FORMAT_R32_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,FLOAT);
    break;
  case VK_FORMAT_R32G32_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNSIGNED_INT32);
    break;
  case VK_FORMAT_R32G32_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SIGNED_INT32);
    break;
  case VK_FORMAT_R32G32_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,FLOAT);
    break;
  case VK_FORMAT_R32G32B32_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT32);
    break;
  case VK_FORMAT_R32G32B32_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SIGNED_INT32);
    break;
  case VK_FORMAT_R32G32B32_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,FLOAT);
    break;
  case VK_FORMAT_R32G32B32A32_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT32);
    break;
  case VK_FORMAT_R32G32B32A32_SINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT32);
    break;
  case VK_FORMAT_R32G32B32A32_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,FLOAT);
    break;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,"Unknown image format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
               ,0x22d);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  case VK_FORMAT_R64_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,FLOAT64);
    break;
  case VK_FORMAT_R64G64_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,FLOAT64);
    break;
  case VK_FORMAT_R64G64B64_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,FLOAT64);
    break;
  case VK_FORMAT_R64G64B64A64_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,FLOAT64);
    break;
  case VK_FORMAT_B10G11R11_UFLOAT_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT_11F_11F_10F_REV);
    break;
  case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT_999_E5_REV);
    break;
  case VK_FORMAT_D16_UNORM:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,D,UNORM_INT16);
    break;
  case VK_FORMAT_X8_D24_UNORM_PACK32:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,D,UNSIGNED_INT_24_8_REV);
    break;
  case VK_FORMAT_D32_SFLOAT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,D,FLOAT);
    break;
  case VK_FORMAT_S8_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,S,UNSIGNED_INT8);
    break;
  case VK_FORMAT_D16_UNORM_S8_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,DS,UNSIGNED_INT_16_8_8);
    break;
  case VK_FORMAT_D24_UNORM_S8_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,DS,UNSIGNED_INT_24_8_REV);
    break;
  case VK_FORMAT_D32_SFLOAT_S8_UINT:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,DS,FLOAT_UNSIGNED_INT_24_8_REV);
  }
  return TStack_10;
}

Assistant:

tcu::TextureFormat mapVkFormat (VkFormat format)
{
	using tcu::TextureFormat;

	// update this mapping if VkFormat changes
	DE_STATIC_ASSERT(VK_CORE_FORMAT_LAST == 185);

	switch (format)
	{
		case VK_FORMAT_R4G4_UNORM_PACK8:		return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_BYTE_44);
		case VK_FORMAT_R5G6B5_UNORM_PACK16:		return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_SHORT_565);
		case VK_FORMAT_R4G4B4A4_UNORM_PACK16:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_SHORT_4444);
		case VK_FORMAT_R5G5B5A1_UNORM_PACK16:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_SHORT_5551);

		case VK_FORMAT_B5G6R5_UNORM_PACK16:		return TextureFormat(TextureFormat::BGR,	TextureFormat::UNORM_SHORT_565);
		case VK_FORMAT_B4G4R4A4_UNORM_PACK16:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNORM_SHORT_4444);
		case VK_FORMAT_B5G5R5A1_UNORM_PACK16:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNORM_SHORT_5551);

		case VK_FORMAT_A1R5G5B5_UNORM_PACK16:	return TextureFormat(TextureFormat::ARGB,	TextureFormat::UNORM_SHORT_1555);

		case VK_FORMAT_R8_UNORM:				return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT8);
		case VK_FORMAT_R8_SNORM:				return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT8);
		case VK_FORMAT_R8_USCALED:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8_SSCALED:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8_UINT:					return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8_SINT:					return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8_SRGB:					return TextureFormat(TextureFormat::sR,		TextureFormat::UNORM_INT8);

		case VK_FORMAT_R8G8_UNORM:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT8);
		case VK_FORMAT_R8G8_SNORM:				return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT8);
		case VK_FORMAT_R8G8_USCALED:			return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8_SSCALED:			return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8_UINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8_SINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8_SRGB:				return TextureFormat(TextureFormat::sRG,	TextureFormat::UNORM_INT8);

		case VK_FORMAT_R8G8B8_UNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
		case VK_FORMAT_R8G8B8_SNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SNORM_INT8);
		case VK_FORMAT_R8G8B8_USCALED:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8B8_SSCALED:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8B8_UINT:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8B8_SINT:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8B8_SRGB:				return TextureFormat(TextureFormat::sRGB,	TextureFormat::UNORM_INT8);

		case VK_FORMAT_R8G8B8A8_UNORM:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
		case VK_FORMAT_R8G8B8A8_SNORM:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT8);
		case VK_FORMAT_R8G8B8A8_USCALED:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8B8A8_SSCALED:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8B8A8_UINT:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8B8A8_SINT:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8B8A8_SRGB:			return TextureFormat(TextureFormat::sRGBA,	TextureFormat::UNORM_INT8);

		case VK_FORMAT_R16_UNORM:				return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT16);
		case VK_FORMAT_R16_SNORM:				return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT16);
		case VK_FORMAT_R16_USCALED:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16_SSCALED:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16_UINT:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16_SINT:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16_SFLOAT:				return TextureFormat(TextureFormat::R,		TextureFormat::HALF_FLOAT);

		case VK_FORMAT_R16G16_UNORM:			return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT16);
		case VK_FORMAT_R16G16_SNORM:			return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT16);
		case VK_FORMAT_R16G16_USCALED:			return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16_SSCALED:			return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16_UINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16_SINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16_SFLOAT:			return TextureFormat(TextureFormat::RG,		TextureFormat::HALF_FLOAT);

		case VK_FORMAT_R16G16B16_UNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT16);
		case VK_FORMAT_R16G16B16_SNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SNORM_INT16);
		case VK_FORMAT_R16G16B16_USCALED:		return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16B16_SSCALED:		return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16B16_UINT:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16B16_SINT:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16B16_SFLOAT:		return TextureFormat(TextureFormat::RGB,	TextureFormat::HALF_FLOAT);

		case VK_FORMAT_R16G16B16A16_UNORM:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT16);
		case VK_FORMAT_R16G16B16A16_SNORM:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT16);
		case VK_FORMAT_R16G16B16A16_USCALED:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16B16A16_SSCALED:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16B16A16_UINT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16B16A16_SINT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16B16A16_SFLOAT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::HALF_FLOAT);

		case VK_FORMAT_R32_UINT:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT32);
		case VK_FORMAT_R32_SINT:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT32);
		case VK_FORMAT_R32_SFLOAT:				return TextureFormat(TextureFormat::R,		TextureFormat::FLOAT);

		case VK_FORMAT_R32G32_UINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT32);
		case VK_FORMAT_R32G32_SINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT32);
		case VK_FORMAT_R32G32_SFLOAT:			return TextureFormat(TextureFormat::RG,		TextureFormat::FLOAT);

		case VK_FORMAT_R32G32B32_UINT:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT32);
		case VK_FORMAT_R32G32B32_SINT:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT32);
		case VK_FORMAT_R32G32B32_SFLOAT:		return TextureFormat(TextureFormat::RGB,	TextureFormat::FLOAT);

		case VK_FORMAT_R32G32B32A32_UINT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT32);
		case VK_FORMAT_R32G32B32A32_SINT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT32);
		case VK_FORMAT_R32G32B32A32_SFLOAT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::FLOAT);

		case VK_FORMAT_R64_SFLOAT:				return TextureFormat(TextureFormat::R,		TextureFormat::FLOAT64);
		case VK_FORMAT_R64G64_SFLOAT:			return TextureFormat(TextureFormat::RG,		TextureFormat::FLOAT64);
		case VK_FORMAT_R64G64B64_SFLOAT:		return TextureFormat(TextureFormat::RGB,	TextureFormat::FLOAT64);
		case VK_FORMAT_R64G64B64A64_SFLOAT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::FLOAT64);

		case VK_FORMAT_B10G11R11_UFLOAT_PACK32:	return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT_11F_11F_10F_REV);
		case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:	return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT_999_E5_REV);

		case VK_FORMAT_B8G8R8_UNORM:			return TextureFormat(TextureFormat::BGR,	TextureFormat::UNORM_INT8);
		case VK_FORMAT_B8G8R8_SNORM:			return TextureFormat(TextureFormat::BGR,	TextureFormat::SNORM_INT8);
		case VK_FORMAT_B8G8R8_USCALED:			return TextureFormat(TextureFormat::BGR,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_B8G8R8_SSCALED:			return TextureFormat(TextureFormat::BGR,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_B8G8R8_UINT:				return TextureFormat(TextureFormat::BGR,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_B8G8R8_SINT:				return TextureFormat(TextureFormat::BGR,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_B8G8R8_SRGB:				return TextureFormat(TextureFormat::sBGR,	TextureFormat::UNORM_INT8);

		case VK_FORMAT_B8G8R8A8_UNORM:			return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNORM_INT8);
		case VK_FORMAT_B8G8R8A8_SNORM:			return TextureFormat(TextureFormat::BGRA,	TextureFormat::SNORM_INT8);
		case VK_FORMAT_B8G8R8A8_USCALED:		return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_B8G8R8A8_SSCALED:		return TextureFormat(TextureFormat::BGRA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_B8G8R8A8_UINT:			return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_B8G8R8A8_SINT:			return TextureFormat(TextureFormat::BGRA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_B8G8R8A8_SRGB:			return TextureFormat(TextureFormat::sBGRA,	TextureFormat::UNORM_INT8);

		case VK_FORMAT_D16_UNORM:				return TextureFormat(TextureFormat::D,		TextureFormat::UNORM_INT16);
		case VK_FORMAT_X8_D24_UNORM_PACK32:		return TextureFormat(TextureFormat::D,		TextureFormat::UNSIGNED_INT_24_8_REV);
		case VK_FORMAT_D32_SFLOAT:				return TextureFormat(TextureFormat::D,		TextureFormat::FLOAT);

		case VK_FORMAT_S8_UINT:					return TextureFormat(TextureFormat::S,		TextureFormat::UNSIGNED_INT8);

		// \note There is no standard interleaved memory layout for DS formats; buffer-image copies
		//		 will always operate on either D or S aspect only. See Khronos bug 12998
		case VK_FORMAT_D16_UNORM_S8_UINT:		return TextureFormat(TextureFormat::DS,		TextureFormat::UNSIGNED_INT_16_8_8);
		case VK_FORMAT_D24_UNORM_S8_UINT:		return TextureFormat(TextureFormat::DS,		TextureFormat::UNSIGNED_INT_24_8_REV);
		case VK_FORMAT_D32_SFLOAT_S8_UINT:		return TextureFormat(TextureFormat::DS,		TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV);

#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
		case VK_FORMAT_A8B8G8R8_UNORM_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
		case VK_FORMAT_A8B8G8R8_SNORM_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT8);
		case VK_FORMAT_A8B8G8R8_USCALED_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_A8B8G8R8_SSCALED_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_A8B8G8R8_UINT_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_A8B8G8R8_SINT_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_A8B8G8R8_SRGB_PACK32:	return TextureFormat(TextureFormat::sRGBA,	TextureFormat::UNORM_INT8);
#else
#	error "Big-endian not supported"
#endif

		case VK_FORMAT_A2R10G10B10_UNORM_PACK32:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNORM_INT_1010102_REV);
		case VK_FORMAT_A2R10G10B10_SNORM_PACK32:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::SNORM_INT_1010102_REV);
		case VK_FORMAT_A2R10G10B10_USCALED_PACK32:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::SIGNED_INT_1010102_REV);
		case VK_FORMAT_A2R10G10B10_UINT_PACK32:		return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case VK_FORMAT_A2R10G10B10_SINT_PACK32:		return TextureFormat(TextureFormat::BGRA,	TextureFormat::SIGNED_INT_1010102_REV);

		case VK_FORMAT_A2B10G10R10_UNORM_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT_1010102_REV);
		case VK_FORMAT_A2B10G10R10_SNORM_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT_1010102_REV);
		case VK_FORMAT_A2B10G10R10_USCALED_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT_1010102_REV);
		case VK_FORMAT_A2B10G10R10_UINT_PACK32:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case VK_FORMAT_A2B10G10R10_SINT_PACK32:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT_1010102_REV);

		default:
			TCU_THROW(InternalError, "Unknown image format");
	}
}